

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.h
# Opt level: O2

void __thiscall
psy::C::SemanticModelTester::SemanticModelTester(SemanticModelTester *this,TestSuite *suite)

{
  long lVar1;
  initializer_list<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>
  __l;
  allocator_type local_2a51;
  pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*> local_2a50;
  code *local_2a28;
  undefined8 local_2a20;
  code *local_2a18;
  code *local_2a10;
  char *local_2a08;
  code *local_2a00;
  undefined8 local_29f8;
  code *local_29f0;
  code *local_29e8;
  char *local_29e0;
  code *local_29d8;
  undefined8 local_29d0;
  code *local_29c8;
  code *local_29c0;
  char *local_29b8;
  code *local_29b0;
  undefined8 local_29a8;
  code *local_29a0;
  code *local_2998;
  char *local_2990;
  code *local_2988;
  undefined8 local_2980;
  code *local_2978;
  code *local_2970;
  char *local_2968;
  code *local_2960;
  undefined8 local_2958;
  code *local_2950;
  code *local_2948;
  char *local_2940;
  code *local_2938;
  undefined8 local_2930;
  code *local_2928;
  code *local_2920;
  char *local_2918;
  code *local_2910;
  undefined8 local_2908;
  code *local_2900;
  code *local_28f8;
  char *local_28f0;
  code *local_28e8;
  undefined8 local_28e0;
  code *local_28d8;
  code *local_28d0;
  char *local_28c8;
  code *local_28c0;
  undefined8 local_28b8;
  code *local_28b0;
  code *local_28a8;
  char *local_28a0;
  code *local_2898;
  undefined8 local_2890;
  code *local_2888;
  code *local_2880;
  char *local_2878;
  code *local_2870;
  undefined8 local_2868;
  code *local_2860;
  code *local_2858;
  char *local_2850;
  code *local_2848;
  undefined8 local_2840;
  code *local_2838;
  code *local_2830;
  char *local_2828;
  code *local_2820;
  undefined8 local_2818;
  code *local_2810;
  code *local_2808;
  char *local_2800;
  code *local_27f8;
  undefined8 local_27f0;
  code *local_27e8;
  code *local_27e0;
  char *local_27d8;
  code *local_27d0;
  undefined8 local_27c8;
  code *local_27c0;
  code *local_27b8;
  char *local_27b0;
  code *local_27a8;
  undefined8 local_27a0;
  code *local_2798;
  code *local_2790;
  char *local_2788;
  code *local_2780;
  undefined8 local_2778;
  code *local_2770;
  code *local_2768;
  char *local_2760;
  code *local_2758;
  undefined8 local_2750;
  code *local_2748;
  code *local_2740;
  char *local_2738;
  code *local_2730;
  undefined8 local_2728;
  code *local_2720;
  code *local_2718;
  char *local_2710;
  code *local_2708;
  undefined8 local_2700;
  code *local_26f8;
  code *local_26f0;
  char *local_26e8;
  code *local_26e0;
  undefined8 local_26d8;
  code *local_26d0;
  code *local_26c8;
  char *local_26c0;
  code *local_26b8;
  undefined8 local_26b0;
  code *local_26a8;
  code *local_26a0;
  char *local_2698;
  code *local_2690;
  undefined8 local_2688;
  code *local_2680;
  code *local_2678;
  char *local_2670;
  code *local_2668;
  undefined8 local_2660;
  code *local_2658;
  code *local_2650;
  char *local_2648;
  code *local_2640;
  undefined8 local_2638;
  code *local_2630;
  code *local_2628;
  char *local_2620;
  code *local_2618;
  undefined8 local_2610;
  code *local_2608;
  code *local_2600;
  char *local_25f8;
  code *local_25f0;
  undefined8 local_25e8;
  code *local_25e0;
  code *local_25d8;
  char *local_25d0;
  code *local_25c8;
  undefined8 local_25c0;
  code *local_25b8;
  code *local_25b0;
  char *local_25a8;
  code *local_25a0;
  undefined8 local_2598;
  code *local_2590;
  code *local_2588;
  char *local_2580;
  code *local_2578;
  undefined8 local_2570;
  code *local_2568;
  code *local_2560;
  char *local_2558;
  code *local_2550;
  undefined8 local_2548;
  code *local_2540;
  code *local_2538;
  char *local_2530;
  code *local_2528;
  undefined8 local_2520;
  code *local_2518;
  code *local_2510;
  char *local_2508;
  code *local_2500;
  undefined8 local_24f8;
  code *local_24f0;
  code *local_24e8;
  char *local_24e0;
  code *local_24d8;
  undefined8 local_24d0;
  code *local_24c8;
  code *local_24c0;
  char *local_24b8;
  code *local_24b0;
  undefined8 local_24a8;
  code *local_24a0;
  code *local_2498;
  char *local_2490;
  code *local_2488;
  undefined8 local_2480;
  code *local_2478;
  code *local_2470;
  char *local_2468;
  code *local_2460;
  undefined8 local_2458;
  code *local_2450;
  code *local_2448;
  char *local_2440;
  code *local_2438;
  undefined8 local_2430;
  code *local_2428;
  code *local_2420;
  char *local_2418;
  code *local_2410;
  undefined8 local_2408;
  code *local_2400;
  code *local_23f8;
  char *local_23f0;
  code *local_23e8;
  undefined8 local_23e0;
  code *local_23d8;
  code *local_23d0;
  char *local_23c8;
  code *local_23c0;
  undefined8 local_23b8;
  code *local_23b0;
  code *local_23a8;
  char *local_23a0;
  code *local_2398;
  undefined8 local_2390;
  code *local_2388;
  code *local_2380;
  char *local_2378;
  code *local_2370;
  undefined8 local_2368;
  code *local_2360;
  code *local_2358;
  char *local_2350;
  code *local_2348;
  undefined8 local_2340;
  code *local_2338;
  code *local_2330;
  char *local_2328;
  code *local_2320;
  undefined8 local_2318;
  code *local_2310;
  code *local_2308;
  char *local_2300;
  code *local_22f8;
  undefined8 local_22f0;
  code *local_22e8;
  code *local_22e0;
  char *local_22d8;
  code *local_22d0;
  undefined8 local_22c8;
  code *local_22c0;
  code *local_22b8;
  char *local_22b0;
  code *local_22a8;
  undefined8 local_22a0;
  code *local_2298;
  code *local_2290;
  char *local_2288;
  code *local_2280;
  undefined8 local_2278;
  code *local_2270;
  code *local_2268;
  char *local_2260;
  code *local_2258;
  undefined8 local_2250;
  code *local_2248;
  code *local_2240;
  char *local_2238;
  code *local_2230;
  undefined8 local_2228;
  code *local_2220;
  code *local_2218;
  char *local_2210;
  code *local_2208;
  undefined8 local_2200;
  code *local_21f8;
  code *local_21f0;
  char *local_21e8;
  code *local_21e0;
  undefined8 local_21d8;
  code *local_21d0;
  code *local_21c8;
  char *local_21c0;
  code *local_21b8;
  undefined8 local_21b0;
  code *local_21a8;
  code *local_21a0;
  char *local_2198;
  code *local_2190;
  undefined8 local_2188;
  code *local_2180;
  code *local_2178;
  char *local_2170;
  code *local_2168;
  undefined8 local_2160;
  code *local_2158;
  code *local_2150;
  char *local_2148;
  code *local_2140;
  undefined8 local_2138;
  code *local_2130;
  code *local_2128;
  char *local_2120;
  code *local_2118;
  undefined8 local_2110;
  code *local_2108;
  code *local_2100;
  char *local_20f8;
  code *local_20f0;
  undefined8 local_20e8;
  code *local_20e0;
  code *local_20d8;
  char *local_20d0;
  code *local_20c8;
  undefined8 local_20c0;
  code *local_20b8;
  code *local_20b0;
  char *local_20a8;
  code *local_20a0;
  undefined8 local_2098;
  code *local_2090;
  code *local_2088;
  char *local_2080;
  code *local_2078;
  undefined8 local_2070;
  code *local_2068;
  code *local_2060;
  char *local_2058;
  code *local_2050;
  undefined8 local_2048;
  code *local_2040;
  code *local_2038;
  char *local_2030;
  code *local_2028;
  undefined8 local_2020;
  code *local_2018;
  code *local_2010;
  char *local_2008;
  code *local_2000;
  undefined8 local_1ff8;
  code *local_1ff0;
  code *local_1fe8;
  char *local_1fe0;
  code *local_1fd8;
  undefined8 local_1fd0;
  code *local_1fc8;
  code *local_1fc0;
  char *local_1fb8;
  code *local_1fb0;
  undefined8 local_1fa8;
  code *local_1fa0;
  code *local_1f98;
  char *local_1f90;
  code *local_1f88;
  undefined8 local_1f80;
  code *local_1f78;
  code *local_1f70;
  char *local_1f68;
  code *local_1f60;
  undefined8 local_1f58;
  code *local_1f50;
  code *local_1f48;
  char *local_1f40;
  code *local_1f38;
  undefined8 local_1f30;
  code *local_1f28;
  code *local_1f20;
  char *local_1f18;
  code *local_1f10;
  undefined8 local_1f08;
  code *local_1f00;
  code *local_1ef8;
  char *local_1ef0;
  code *local_1ee8;
  undefined8 local_1ee0;
  code *local_1ed8;
  code *local_1ed0;
  char *local_1ec8;
  code *local_1ec0;
  undefined8 local_1eb8;
  code *local_1eb0;
  code *local_1ea8;
  char *local_1ea0;
  code *local_1e98;
  undefined8 local_1e90;
  code *local_1e88;
  code *local_1e80;
  char *local_1e78;
  code *local_1e70;
  undefined8 local_1e68;
  code *local_1e60;
  code *local_1e58;
  char *local_1e50;
  code *local_1e48;
  undefined8 local_1e40;
  code *local_1e38;
  code *local_1e30;
  char *local_1e28;
  code *local_1e20;
  undefined8 local_1e18;
  code *local_1e10;
  code *local_1e08;
  char *local_1e00;
  code *local_1df8;
  undefined8 local_1df0;
  code *local_1de8;
  code *local_1de0;
  char *local_1dd8;
  code *local_1dd0;
  undefined8 local_1dc8;
  code *local_1dc0;
  code *local_1db8;
  char *local_1db0;
  code *local_1da8;
  undefined8 local_1da0;
  code *local_1d98;
  code *local_1d90;
  char *local_1d88;
  code *local_1d80;
  undefined8 local_1d78;
  code *local_1d70;
  code *local_1d68;
  char *local_1d60;
  code *local_1d58;
  undefined8 local_1d50;
  code *local_1d48;
  code *local_1d40;
  char *local_1d38;
  code *local_1d30;
  undefined8 local_1d28;
  code *local_1d20;
  code *local_1d18;
  char *local_1d10;
  code *local_1d08;
  undefined8 local_1d00;
  code *local_1cf8;
  code *local_1cf0;
  char *local_1ce8;
  code *local_1ce0;
  undefined8 local_1cd8;
  code *local_1cd0;
  code *local_1cc8;
  char *local_1cc0;
  code *local_1cb8;
  undefined8 local_1cb0;
  code *local_1ca8;
  code *local_1ca0;
  char *local_1c98;
  code *local_1c90;
  undefined8 local_1c88;
  code *local_1c80;
  code *local_1c78;
  char *local_1c70;
  code *local_1c68;
  undefined8 local_1c60;
  code *local_1c58;
  code *local_1c50;
  char *local_1c48;
  code *local_1c40;
  undefined8 local_1c38;
  code *local_1c30;
  code *local_1c28;
  char *local_1c20;
  code *local_1c18;
  undefined8 local_1c10;
  code *local_1c08;
  code *local_1c00;
  char *local_1bf8;
  code *local_1bf0;
  undefined8 local_1be8;
  code *local_1be0;
  code *local_1bd8;
  char *local_1bd0;
  code *local_1bc8;
  undefined8 local_1bc0;
  code *local_1bb8;
  code *local_1bb0;
  char *local_1ba8;
  code *local_1ba0;
  undefined8 local_1b98;
  code *local_1b90;
  code *local_1b88;
  char *local_1b80;
  code *local_1b78;
  undefined8 local_1b70;
  code *local_1b68;
  code *local_1b60;
  char *local_1b58;
  code *local_1b50;
  undefined8 local_1b48;
  code *local_1b40;
  code *local_1b38;
  char *local_1b30;
  code *local_1b28;
  undefined8 local_1b20;
  code *local_1b18;
  code *local_1b10;
  char *local_1b08;
  code *local_1b00;
  undefined8 local_1af8;
  code *local_1af0;
  code *local_1ae8;
  char *local_1ae0;
  code *local_1ad8;
  undefined8 local_1ad0;
  code *local_1ac8;
  code *local_1ac0;
  char *local_1ab8;
  code *local_1ab0;
  undefined8 local_1aa8;
  code *local_1aa0;
  code *local_1a98;
  char *local_1a90;
  code *local_1a88;
  undefined8 local_1a80;
  code *local_1a78;
  code *local_1a70;
  char *local_1a68;
  code *local_1a60;
  undefined8 local_1a58;
  code *local_1a50;
  code *local_1a48;
  char *local_1a40;
  code *local_1a38;
  undefined8 local_1a30;
  code *local_1a28;
  code *local_1a20;
  char *local_1a18;
  code *local_1a10;
  undefined8 local_1a08;
  code *local_1a00;
  code *local_19f8;
  char *local_19f0;
  code *local_19e8;
  undefined8 local_19e0;
  code *local_19d8;
  code *local_19d0;
  char *local_19c8;
  code *local_19c0;
  undefined8 local_19b8;
  code *local_19b0;
  code *local_19a8;
  char *local_19a0;
  code *local_1998;
  undefined8 local_1990;
  code *local_1988;
  code *local_1980;
  char *local_1978;
  code *local_1970;
  undefined8 local_1968;
  code *local_1960;
  code *local_1958;
  char *local_1950;
  code *local_1948;
  undefined8 local_1940;
  code *local_1938;
  code *local_1930;
  char *local_1928;
  code *local_1920;
  undefined8 local_1918;
  code *local_1910;
  code *local_1908;
  char *local_1900;
  code *local_18f8;
  undefined8 local_18f0;
  code *local_18e8;
  code *local_18e0;
  char *local_18d8;
  code *local_18d0;
  undefined8 local_18c8;
  code *local_18c0;
  code *local_18b8;
  char *local_18b0;
  code *local_18a8;
  undefined8 local_18a0;
  code *local_1898;
  code *local_1890;
  char *local_1888;
  code *local_1880;
  undefined8 local_1878;
  code *local_1870;
  code *local_1868;
  char *local_1860;
  code *local_1858;
  undefined8 local_1850;
  code *local_1848;
  code *local_1840;
  char *local_1838;
  code *local_1830;
  undefined8 local_1828;
  code *local_1820;
  code *local_1818;
  char *local_1810;
  code *local_1808;
  undefined8 local_1800;
  code *local_17f8;
  code *local_17f0;
  char *local_17e8;
  code *local_17e0;
  undefined8 local_17d8;
  code *local_17d0;
  code *local_17c8;
  char *local_17c0;
  code *local_17b8;
  undefined8 local_17b0;
  code *local_17a8;
  code *local_17a0;
  char *local_1798;
  code *local_1790;
  undefined8 local_1788;
  code *local_1780;
  code *local_1778;
  char *local_1770;
  code *local_1768;
  undefined8 local_1760;
  code *local_1758;
  code *local_1750;
  char *local_1748;
  code *local_1740;
  undefined8 local_1738;
  code *local_1730;
  code *local_1728;
  char *local_1720;
  code *local_1718;
  undefined8 local_1710;
  code *local_1708;
  code *local_1700;
  char *local_16f8;
  code *local_16f0;
  undefined8 local_16e8;
  code *local_16e0;
  code *local_16d8;
  char *local_16d0;
  code *local_16c8;
  undefined8 local_16c0;
  code *local_16b8;
  code *local_16b0;
  char *local_16a8;
  code *local_16a0;
  undefined8 local_1698;
  code *local_1690;
  code *local_1688;
  char *local_1680;
  code *local_1678;
  undefined8 local_1670;
  code *local_1668;
  code *local_1660;
  char *local_1658;
  code *local_1650;
  undefined8 local_1648;
  code *local_1640;
  code *local_1638;
  char *local_1630;
  code *local_1628;
  undefined8 local_1620;
  code *local_1618;
  code *local_1610;
  char *local_1608;
  code *local_1600;
  undefined8 local_15f8;
  code *local_15f0;
  code *local_15e8;
  char *local_15e0;
  code *local_15d8;
  undefined8 local_15d0;
  code *local_15c8;
  code *local_15c0;
  char *local_15b8;
  code *local_15b0;
  undefined8 local_15a8;
  code *local_15a0;
  code *local_1598;
  char *local_1590;
  code *local_1588;
  undefined8 local_1580;
  code *local_1578;
  code *local_1570;
  char *local_1568;
  code *local_1560;
  undefined8 local_1558;
  code *local_1550;
  code *local_1548;
  char *local_1540;
  code *local_1538;
  undefined8 local_1530;
  code *local_1528;
  code *local_1520;
  char *local_1518;
  code *local_1510;
  undefined8 local_1508;
  code *local_1500;
  code *local_14f8;
  char *local_14f0;
  code *local_14e8;
  undefined8 local_14e0;
  code *local_14d8;
  code *local_14d0;
  char *local_14c8;
  code *local_14c0;
  undefined8 local_14b8;
  code *local_14b0;
  code *local_14a8;
  char *local_14a0;
  code *local_1498;
  undefined8 local_1490;
  code *local_1488;
  code *local_1480;
  char *local_1478;
  code *local_1470;
  undefined8 local_1468;
  code *local_1460;
  code *local_1458;
  char *local_1450;
  code *local_1448;
  undefined8 local_1440;
  code *local_1438;
  code *local_1430;
  char *local_1428;
  code *local_1420;
  undefined8 local_1418;
  code *local_1410;
  code *local_1408;
  char *local_1400;
  code *local_13f8;
  undefined8 local_13f0;
  code *local_13e8;
  code *local_13e0;
  char *local_13d8;
  code *local_13d0;
  undefined8 local_13c8;
  code *local_13c0;
  code *local_13b8;
  char *local_13b0;
  code *local_13a8;
  undefined8 local_13a0;
  code *local_1398;
  code *local_1390;
  char *local_1388;
  code *local_1380;
  undefined8 local_1378;
  code *local_1370;
  code *local_1368;
  char *local_1360;
  code *local_1358;
  undefined8 local_1350;
  code *local_1348;
  code *local_1340;
  char *local_1338;
  code *local_1330;
  undefined8 local_1328;
  code *local_1320;
  code *local_1318;
  char *local_1310;
  code *local_1308;
  undefined8 local_1300;
  code *local_12f8;
  code *local_12f0;
  char *local_12e8;
  code *local_12e0;
  undefined8 local_12d8;
  code *local_12d0;
  code *local_12c8;
  char *local_12c0;
  code *local_12b8;
  undefined8 local_12b0;
  code *local_12a8;
  code *local_12a0;
  char *local_1298;
  code *local_1290;
  undefined8 local_1288;
  code *local_1280;
  code *local_1278;
  char *local_1270;
  code *local_1268;
  undefined8 local_1260;
  code *local_1258;
  code *local_1250;
  char *local_1248;
  code *local_1240;
  undefined8 local_1238;
  code *local_1230;
  code *local_1228;
  char *local_1220;
  code *local_1218;
  undefined8 local_1210;
  code *local_1208;
  code *local_1200;
  char *local_11f8;
  code *local_11f0;
  undefined8 local_11e8;
  code *local_11e0;
  code *local_11d8;
  char *local_11d0;
  code *local_11c8;
  undefined8 local_11c0;
  code *local_11b8;
  code *local_11b0;
  char *local_11a8;
  code *local_11a0;
  undefined8 local_1198;
  code *local_1190;
  code *local_1188;
  char *local_1180;
  code *local_1178;
  undefined8 local_1170;
  code *local_1168;
  code *local_1160;
  char *local_1158;
  code *local_1150;
  undefined8 local_1148;
  code *local_1140;
  code *local_1138;
  char *local_1130;
  code *local_1128;
  undefined8 local_1120;
  code *local_1118;
  code *local_1110;
  char *local_1108;
  code *local_1100;
  undefined8 local_10f8;
  code *local_10f0;
  code *local_10e8;
  char *local_10e0;
  code *local_10d8;
  undefined8 local_10d0;
  code *local_10c8;
  code *local_10c0;
  char *local_10b8;
  code *local_10b0;
  undefined8 local_10a8;
  code *local_10a0;
  code *local_1098;
  char *local_1090;
  code *local_1088;
  undefined8 local_1080;
  code *local_1078;
  code *local_1070;
  char *local_1068;
  code *local_1060;
  undefined8 local_1058;
  code *local_1050;
  code *local_1048;
  char *local_1040;
  code *local_1038;
  undefined8 local_1030;
  code *local_1028;
  code *local_1020;
  char *local_1018;
  code *local_1010;
  undefined8 local_1008;
  code *local_1000;
  code *local_ff8;
  char *local_ff0;
  code *local_fe8;
  undefined8 local_fe0;
  code *local_fd8;
  code *local_fd0;
  char *local_fc8;
  code *local_fc0;
  undefined8 local_fb8;
  code *local_fb0;
  code *local_fa8;
  char *local_fa0;
  code *local_f98;
  undefined8 local_f90;
  code *local_f88;
  code *local_f80;
  char *local_f78;
  code *local_f70;
  undefined8 local_f68;
  code *local_f60;
  code *local_f58;
  char *local_f50;
  code *local_f48;
  undefined8 local_f40;
  code *local_f38;
  code *local_f30;
  char *local_f28;
  code *local_f20;
  undefined8 local_f18;
  code *local_f10;
  code *local_f08;
  char *local_f00;
  code *local_ef8;
  undefined8 local_ef0;
  code *local_ee8;
  code *local_ee0;
  char *local_ed8;
  code *local_ed0;
  undefined8 local_ec8;
  code *local_ec0;
  code *local_eb8;
  char *local_eb0;
  code *local_ea8;
  undefined8 local_ea0;
  code *local_e98;
  code *local_e90;
  char *local_e88;
  code *local_e80;
  undefined8 local_e78;
  code *local_e70;
  code *local_e68;
  char *local_e60;
  code *local_e58;
  undefined8 local_e50;
  code *local_e48;
  code *local_e40;
  char *local_e38;
  code *local_e30;
  undefined8 local_e28;
  code *local_e20;
  code *local_e18;
  char *local_e10;
  code *local_e08;
  undefined8 local_e00;
  code *local_df8;
  code *local_df0;
  char *local_de8;
  code *local_de0;
  undefined8 local_dd8;
  code *local_dd0;
  code *local_dc8;
  char *local_dc0;
  code *local_db8;
  undefined8 local_db0;
  code *local_da8;
  code *local_da0;
  char *local_d98;
  code *local_d90;
  undefined8 local_d88;
  code *local_d80;
  code *local_d78;
  char *local_d70;
  code *local_d68;
  undefined8 local_d60;
  code *local_d58;
  code *local_d50;
  char *local_d48;
  code *local_d40;
  undefined8 local_d38;
  code *local_d30;
  code *local_d28;
  char *local_d20;
  code *local_d18;
  undefined8 local_d10;
  code *local_d08;
  code *local_d00;
  char *local_cf8;
  code *local_cf0;
  undefined8 local_ce8;
  code *local_ce0;
  code *local_cd8;
  char *local_cd0;
  code *local_cc8;
  undefined8 local_cc0;
  code *local_cb8;
  code *local_cb0;
  char *local_ca8;
  code *local_ca0;
  undefined8 local_c98;
  code *local_c90;
  code *local_c88;
  char *local_c80;
  code *local_c78;
  undefined8 local_c70;
  code *local_c68;
  code *local_c60;
  char *local_c58;
  code *local_c50;
  undefined8 local_c48;
  code *local_c40;
  code *local_c38;
  char *local_c30;
  code *local_c28;
  undefined8 local_c20;
  code *local_c18;
  code *local_c10;
  char *local_c08;
  code *local_c00;
  undefined8 local_bf8;
  code *local_bf0;
  code *local_be8;
  char *local_be0;
  code *local_bd8;
  undefined8 local_bd0;
  code *local_bc8;
  code *local_bc0;
  char *local_bb8;
  code *local_bb0;
  undefined8 local_ba8;
  code *local_ba0;
  code *local_b98;
  char *local_b90;
  code *local_b88;
  undefined8 local_b80;
  code *local_b78;
  code *local_b70;
  char *local_b68;
  code *local_b60;
  undefined8 local_b58;
  code *local_b50;
  code *local_b48;
  char *local_b40;
  code *local_b38;
  undefined8 local_b30;
  code *local_b28;
  code *local_b20;
  char *local_b18;
  code *local_b10;
  undefined8 local_b08;
  code *local_b00;
  code *local_af8;
  char *local_af0;
  code *local_ae8;
  undefined8 local_ae0;
  code *local_ad8;
  code *local_ad0;
  char *local_ac8;
  code *local_ac0;
  undefined8 local_ab8;
  code *local_ab0;
  code *local_aa8;
  char *local_aa0;
  code *local_a98;
  undefined8 local_a90;
  code *local_a88;
  code *local_a80;
  char *local_a78;
  code *local_a70;
  undefined8 local_a68;
  code *local_a60;
  code *local_a58;
  char *local_a50;
  code *local_a48;
  undefined8 local_a40;
  code *local_a38;
  code *local_a30;
  char *local_a28;
  code *local_a20;
  undefined8 local_a18;
  code *local_a10;
  code *local_a08;
  char *local_a00;
  code *local_9f8;
  undefined8 local_9f0;
  code *local_9e8;
  code *local_9e0;
  char *local_9d8;
  code *local_9d0;
  undefined8 local_9c8;
  code *local_9c0;
  code *local_9b8;
  char *local_9b0;
  code *local_9a8;
  undefined8 local_9a0;
  code *local_998;
  code *local_990;
  char *local_988;
  code *local_980;
  undefined8 local_978;
  code *local_970;
  code *local_968;
  char *local_960;
  code *local_958;
  undefined8 local_950;
  code *local_948;
  code *local_940;
  char *local_938;
  code *local_930;
  undefined8 local_928;
  code *local_920;
  code *local_918;
  char *local_910;
  code *local_908;
  undefined8 local_900;
  code *local_8f8;
  code *local_8f0;
  char *local_8e8;
  code *local_8e0;
  undefined8 local_8d8;
  code *local_8d0;
  code *local_8c8;
  char *local_8c0;
  code *local_8b8;
  undefined8 local_8b0;
  code *local_8a8;
  code *local_8a0;
  char *local_898;
  code *local_890;
  undefined8 local_888;
  code *local_880;
  code *local_878;
  char *local_870;
  code *local_868;
  undefined8 local_860;
  code *local_858;
  code *local_850;
  char *local_848;
  code *local_840;
  undefined8 local_838;
  code *local_830;
  code *local_828;
  char *local_820;
  code *local_818;
  undefined8 local_810;
  code *local_808;
  code *local_800;
  char *local_7f8;
  code *local_7f0;
  undefined8 local_7e8;
  code *local_7e0;
  code *local_7d8;
  char *local_7d0;
  code *local_7c8;
  undefined8 local_7c0;
  code *local_7b8;
  code *local_7b0;
  char *local_7a8;
  code *local_7a0;
  undefined8 local_798;
  code *local_790;
  code *local_788;
  char *local_780;
  code *local_778;
  undefined8 local_770;
  code *local_768;
  code *local_760;
  char *local_758;
  code *local_750;
  undefined8 local_748;
  code *local_740;
  code *local_738;
  char *local_730;
  code *local_728;
  undefined8 local_720;
  code *local_718;
  code *local_710;
  char *local_708;
  code *local_700;
  undefined8 local_6f8;
  code *local_6f0;
  code *local_6e8;
  char *local_6e0;
  code *local_6d8;
  undefined8 local_6d0;
  code *local_6c8;
  code *local_6c0;
  char *local_6b8;
  code *local_6b0;
  undefined8 local_6a8;
  code *local_6a0;
  code *local_698;
  char *local_690;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  code *local_670;
  char *local_668;
  code *local_660;
  undefined8 local_658;
  code *local_650;
  code *local_648;
  char *local_640;
  code *local_638;
  undefined8 local_630;
  code *local_628;
  code *local_620;
  char *local_618;
  code *local_610;
  undefined8 local_608;
  code *local_600;
  code *local_5f8;
  char *local_5f0;
  code *local_5e8;
  undefined8 local_5e0;
  code *local_5d8;
  code *local_5d0;
  char *local_5c8;
  code *local_5c0;
  undefined8 local_5b8;
  code *local_5b0;
  code *local_5a8;
  char *local_5a0;
  code *local_598;
  undefined8 local_590;
  code *local_588;
  code *local_580;
  char *local_578;
  code *local_570;
  undefined8 local_568;
  code *local_560;
  code *local_558;
  char *local_550;
  code *local_548;
  undefined8 local_540;
  code *local_538;
  code *local_530;
  char *local_528;
  code *local_520;
  undefined8 local_518;
  code *local_510;
  code *local_508;
  char *local_500;
  code *local_4f8;
  undefined8 local_4f0;
  code *local_4e8;
  code *local_4e0;
  char *local_4d8;
  code *local_4d0;
  undefined8 local_4c8;
  code *local_4c0;
  code *local_4b8;
  char *local_4b0;
  code *local_4a8;
  undefined8 local_4a0;
  code *local_498;
  code *local_490;
  char *local_488;
  code *local_480;
  undefined8 local_478;
  code *local_470;
  code *local_468;
  char *local_460;
  code *local_458;
  undefined8 local_450;
  code *local_448;
  code *local_440;
  char *local_438;
  code *local_430;
  undefined8 local_428;
  code *local_420;
  code *local_418;
  char *local_410;
  code *local_408;
  undefined8 local_400;
  code *local_3f8;
  code *local_3f0;
  char *local_3e8;
  code *local_3e0;
  undefined8 local_3d8;
  code *local_3d0;
  code *local_3c8;
  char *local_3c0;
  code *local_3b8;
  undefined8 local_3b0;
  code *local_3a8;
  code *local_3a0;
  char *local_398;
  code *local_390;
  undefined8 local_388;
  code *local_380;
  code *local_378;
  char *local_370;
  code *local_368;
  undefined8 local_360;
  code *local_358;
  code *local_350;
  char *local_348;
  code *local_340;
  undefined8 local_338;
  code *local_330;
  code *local_328;
  char *local_320;
  code *local_318;
  undefined8 local_310;
  code *local_308;
  code *local_300;
  char *local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  code *local_2d8;
  char *local_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  code *local_2b0;
  char *local_2a8;
  code *local_2a0;
  undefined8 local_298;
  code *local_290;
  code *local_288;
  char *local_280;
  code *local_278;
  undefined8 local_270;
  code *local_268;
  code *local_260;
  char *local_258;
  code *local_250;
  undefined8 local_248;
  code *local_240;
  code *local_238;
  char *local_230;
  code *local_228;
  undefined8 local_220;
  code *local_218;
  code *local_210;
  char *local_208;
  code *local_200;
  undefined8 local_1f8;
  code *local_1f0;
  code *local_1e8;
  char *local_1e0;
  code *local_1d8;
  undefined8 local_1d0;
  code *local_1c8;
  code *local_1c0;
  char *local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  code *local_198;
  char *local_190;
  code *local_188;
  undefined8 local_180;
  code *local_178;
  code *local_170;
  char *local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  code *local_148;
  char *local_140;
  code *local_138;
  undefined8 local_130;
  code *local_128;
  code *local_120;
  char *local_118;
  code *local_110;
  undefined8 local_108;
  code *local_100;
  code *local_f8;
  char *local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  code *local_d0;
  char *local_c8;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  code *local_a8;
  char *local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  code *local_80;
  char *local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  char *local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  char *local_28;
  
  (this->super_Tester).suite_ = suite;
  (this->super_Tester).cntPassed_ = 0;
  (this->super_Tester).cntFailed_ = 0;
  (this->super_Tester).curTestFunc_._M_dataplus._M_p =
       (pointer)&(this->super_Tester).curTestFunc_.field_2;
  (this->super_Tester).curTestFunc_._M_string_length = 0;
  (this->super_Tester).curTestFunc_.field_2._M_local_buf[0] = '\0';
  (this->super_Tester)._vptr_Tester = (_func_int **)&PTR__SemanticModelTester_004d9f80;
  (this->tree_)._M_t.
  super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
  super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl = (SyntaxTree *)0x0;
  (this->compilation_)._M_t.
  super___uniq_ptr_impl<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::Compilation_*,_std::default_delete<psy::C::Compilation>_>.
  super__Head_base<0UL,_psy::C::Compilation_*,_false>._M_head_impl = (Compilation *)0x0;
  local_2a50.first.super__Function_base._M_functor._M_unused._M_function_pointer = case0001;
  local_2a50.first.super__Function_base._M_functor._8_8_ = 0;
  local_2a50.first._M_invoker =
       std::
       _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
       ::_M_invoke;
  local_2a50.first.super__Function_base._M_manager =
       std::
       _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
       ::_M_manager;
  local_2a50.second = "case0001";
  local_2a28 = case0002;
  local_2a20 = 0;
  local_2a10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2a18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2a08 = "case0002";
  local_2a00 = case0003;
  local_29f8 = 0;
  local_29e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_29f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29e0 = "case0003";
  local_29d8 = case0004;
  local_29d0 = 0;
  local_29c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_29c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29b8 = "case0004";
  local_29b0 = case0005;
  local_29a8 = 0;
  local_2998 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_29a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2990 = "case0005";
  local_2988 = case0006;
  local_2980 = 0;
  local_2970 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2978 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2968 = "case0006";
  local_2960 = case0007;
  local_2958 = 0;
  local_2948 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2950 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2940 = "case0007";
  local_2938 = case0008;
  local_2930 = 0;
  local_2920 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2928 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2918 = "case0008";
  local_2910 = case0009;
  local_2908 = 0;
  local_28f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2900 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28f0 = "case0009";
  local_28e8 = case0010;
  local_28e0 = 0;
  local_28d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_28d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28c8 = "case0010";
  local_28c0 = case0090;
  local_28b8 = 0;
  local_28a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_28b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28a0 = "case0090";
  local_2898 = case0091;
  local_2890 = 0;
  local_2880 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2888 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2878 = "case0091";
  local_2870 = case0092;
  local_2868 = 0;
  local_2858 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2860 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2850 = "case0092";
  local_2848 = case0093;
  local_2840 = 0;
  local_2830 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2838 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2828 = "case0093";
  local_2820 = case0094;
  local_2818 = 0;
  local_2808 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2810 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2800 = "case0094";
  local_27f8 = case0095;
  local_27f0 = 0;
  local_27e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_27e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27d8 = "case0095";
  local_27d0 = case0096;
  local_27c8 = 0;
  local_27b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_27c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27b0 = "case0096";
  local_27a8 = case0097;
  local_27a0 = 0;
  local_2790 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2798 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2788 = "case0097";
  local_2780 = case0098;
  local_2778 = 0;
  local_2768 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2770 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2760 = "case0098";
  local_2758 = case0099;
  local_2750 = 0;
  local_2740 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2748 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2738 = "case0099";
  local_2730 = case0101;
  local_2728 = 0;
  local_2718 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2720 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2710 = "case0101";
  local_2708 = case0102;
  local_2700 = 0;
  local_26f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_26f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26e8 = "case0102";
  local_26e0 = case0103;
  local_26d8 = 0;
  local_26c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_26d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26c0 = "case0103";
  local_26b8 = case0104;
  local_26b0 = 0;
  local_26a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_26a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2698 = "case0104";
  local_2690 = case0105;
  local_2688 = 0;
  local_2678 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2680 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2670 = "case0105";
  local_2668 = case0106;
  local_2660 = 0;
  local_2650 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2658 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2648 = "case0106";
  local_2640 = case0107;
  local_2638 = 0;
  local_2628 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2630 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2620 = "case0107";
  local_2618 = case0108;
  local_2610 = 0;
  local_2600 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2608 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25f8 = "case0108";
  local_25f0 = case0109;
  local_25e8 = 0;
  local_25d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_25e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25d0 = "case0109";
  local_25c8 = case0110;
  local_25c0 = 0;
  local_25b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_25b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25a8 = "case0110";
  local_25a0 = case0150;
  local_2598 = 0;
  local_2588 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2590 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2580 = "case0150";
  local_2578 = case0151;
  local_2570 = 0;
  local_2560 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2568 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2558 = "case0151";
  local_2550 = case0152;
  local_2548 = 0;
  local_2538 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2540 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2530 = "case0152";
  local_2528 = case0153;
  local_2520 = 0;
  local_2510 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2518 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2508 = "case0153";
  local_2500 = case0154;
  local_24f8 = 0;
  local_24e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_24f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24e0 = "case0154";
  local_24d8 = case0155;
  local_24d0 = 0;
  local_24c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_24c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24b8 = "case0155";
  local_24b0 = case0156;
  local_24a8 = 0;
  local_2498 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_24a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2490 = "case0156";
  local_2488 = case0157;
  local_2480 = 0;
  local_2470 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2478 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2468 = "case0157";
  local_2460 = case0158;
  local_2458 = 0;
  local_2448 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2450 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2440 = "case0158";
  local_2438 = case0159;
  local_2430 = 0;
  local_2420 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2428 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2418 = "case0159";
  local_2410 = case0201;
  local_2408 = 0;
  local_23f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2400 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23f0 = "case0201";
  local_23e8 = case0202;
  local_23e0 = 0;
  local_23d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_23d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23c8 = "case0202";
  local_23c0 = case0203;
  local_23b8 = 0;
  local_23a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_23b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23a0 = "case0203";
  local_2398 = case0204;
  local_2390 = 0;
  local_2380 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2388 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2378 = "case0204";
  local_2370 = case0205;
  local_2368 = 0;
  local_2358 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2360 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2350 = "case0205";
  local_2348 = case0206;
  local_2340 = 0;
  local_2330 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2338 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2328 = "case0206";
  local_2320 = case0207;
  local_2318 = 0;
  local_2308 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2310 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2300 = "case0207";
  local_22f8 = case0208;
  local_22f0 = 0;
  local_22e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_22e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22d8 = "case0208";
  local_22d0 = case0209;
  local_22c8 = 0;
  local_22b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_22c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22b0 = "case0209";
  local_22a8 = case0210;
  local_22a0 = 0;
  local_2290 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2298 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2288 = "case0210";
  local_2280 = case0211;
  local_2278 = 0;
  local_2268 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2270 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2260 = "case0211";
  local_2258 = case0212;
  local_2250 = 0;
  local_2240 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2248 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2238 = "case0212";
  local_2230 = case0213;
  local_2228 = 0;
  local_2218 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2220 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2210 = "case0213";
  local_2208 = case0214;
  local_2200 = 0;
  local_21f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_21f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21e8 = "case0214";
  local_21e0 = case0215;
  local_21d8 = 0;
  local_21c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_21d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21c0 = "case0215";
  local_21b8 = case0216;
  local_21b0 = 0;
  local_21a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_21a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2198 = "case0216";
  local_2190 = case0217;
  local_2188 = 0;
  local_2178 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2180 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2170 = "case0217";
  local_2168 = case0218;
  local_2160 = 0;
  local_2150 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2158 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2148 = "case0218";
  local_2140 = case0219;
  local_2138 = 0;
  local_2128 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2130 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2120 = "case0219";
  local_2118 = case0220;
  local_2110 = 0;
  local_2100 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2108 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20f8 = "case0220";
  local_20f0 = case0300;
  local_20e8 = 0;
  local_20d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_20e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20d0 = "case0300";
  local_20c8 = case0301;
  local_20c0 = 0;
  local_20b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_20b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20a8 = "case0301";
  local_20a0 = case0302;
  local_2098 = 0;
  local_2088 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2090 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2080 = "case0302";
  local_2078 = case0303;
  local_2070 = 0;
  local_2060 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2068 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2058 = "case0303";
  local_2050 = case0304;
  local_2048 = 0;
  local_2038 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2040 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2030 = "case0304";
  local_2028 = case0305;
  local_2020 = 0;
  local_2010 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2018 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2008 = "case0305";
  local_2000 = case0306;
  local_1ff8 = 0;
  local_1fe8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ff0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1fe0 = "case0306";
  local_1fd8 = case0307;
  local_1fd0 = 0;
  local_1fc0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1fc8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1fb8 = "case0307";
  local_1fb0 = case0308;
  local_1fa8 = 0;
  local_1f98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1fa0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f90 = "case0308";
  local_1f88 = case0309;
  local_1f80 = 0;
  local_1f70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f78 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f68 = "case0309";
  local_1f60 = case0310;
  local_1f58 = 0;
  local_1f48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f40 = "case0310";
  local_1f38 = case0311;
  local_1f30 = 0;
  local_1f20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f18 = "case0311";
  local_1f10 = case0312;
  local_1f08 = 0;
  local_1ef8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ef0 = "case0312";
  local_1ee8 = case0313;
  local_1ee0 = 0;
  local_1ed0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ed8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ec8 = "case0313";
  local_1ec0 = case0314;
  local_1eb8 = 0;
  local_1ea8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1eb0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ea0 = "case0314";
  local_1e98 = case0315;
  local_1e90 = 0;
  local_1e80 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e88 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e78 = "case0315";
  local_1e70 = case0316;
  local_1e68 = 0;
  local_1e58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e60 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e50 = "case0316";
  local_1e48 = case0317;
  local_1e40 = 0;
  local_1e30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e38 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e28 = "case0317";
  local_1e20 = case0318;
  local_1e18 = 0;
  local_1e08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e00 = "case0318";
  local_1df8 = case0319;
  local_1df0 = 0;
  local_1de0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1de8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1dd8 = "case0319";
  local_1dd0 = case0320;
  local_1dc8 = 0;
  local_1db8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1dc0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1db0 = "case0320";
  local_1da8 = case0321;
  local_1da0 = 0;
  local_1d90 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d88 = "case0321";
  local_1d80 = case0322;
  local_1d78 = 0;
  local_1d68 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d60 = "case0322";
  local_1d58 = case0323;
  local_1d50 = 0;
  local_1d40 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d38 = "case0323";
  local_1d30 = case0324;
  local_1d28 = 0;
  local_1d18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d10 = "case0324";
  local_1d08 = case0325;
  local_1d00 = 0;
  local_1cf0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1cf8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ce8 = "case0325";
  local_1ce0 = case0326;
  local_1cd8 = 0;
  local_1cc8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1cd0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1cc0 = "case0326";
  local_1cb8 = case0327;
  local_1cb0 = 0;
  local_1ca0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ca8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c98 = "case0327";
  local_1c90 = case0328;
  local_1c88 = 0;
  local_1c78 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c80 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c70 = "case0328";
  local_1c68 = case0329;
  local_1c60 = 0;
  local_1c50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c48 = "case0329";
  local_1c40 = case0330;
  local_1c38 = 0;
  local_1c28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c20 = "case0330";
  local_1c18 = case0331;
  local_1c10 = 0;
  local_1c00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1bf8 = "case0331";
  local_1bf0 = case0332;
  local_1be8 = 0;
  local_1bd8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1be0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1bd0 = "case0332";
  local_1bc8 = case0333;
  local_1bc0 = 0;
  local_1bb0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1bb8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ba8 = "case0333";
  local_1ba0 = case0334;
  local_1b98 = 0;
  local_1b88 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b90 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b80 = "case0334";
  local_1b78 = case0335;
  local_1b70 = 0;
  local_1b60 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b68 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b58 = "case0335";
  local_1b50 = case0336;
  local_1b48 = 0;
  local_1b38 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b40 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b30 = "case0336";
  local_1b28 = case0337;
  local_1b20 = 0;
  local_1b10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b08 = "case0337";
  local_1b00 = case0338;
  local_1af8 = 0;
  local_1ae8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1af0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ae0 = "case0338";
  local_1ad8 = case0339;
  local_1ad0 = 0;
  local_1ac0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ac8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ab8 = "case0339";
  local_1ab0 = case0340;
  local_1aa8 = 0;
  local_1a98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1aa0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a90 = "case0340";
  local_1a88 = case0341;
  local_1a80 = 0;
  local_1a70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a78 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a68 = "case0341";
  local_1a60 = case0342;
  local_1a58 = 0;
  local_1a48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a40 = "case0342";
  local_1a38 = case0343;
  local_1a30 = 0;
  local_1a20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a18 = "case0343";
  local_1a10 = case0344;
  local_1a08 = 0;
  local_19f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19f0 = "case0344";
  local_19e8 = case0345;
  local_19e0 = 0;
  local_19d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_19d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19c8 = "case0345";
  local_19c0 = case0346;
  local_19b8 = 0;
  local_19a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_19b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19a0 = "case0346";
  local_1998 = case0347;
  local_1990 = 0;
  local_1980 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1988 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1978 = "case0347";
  local_1970 = case0348;
  local_1968 = 0;
  local_1958 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1960 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1950 = "case0348";
  local_1948 = case0349;
  local_1940 = 0;
  local_1930 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1938 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1928 = "case0349";
  local_1920 = case0350;
  local_1918 = 0;
  local_1908 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1910 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1900 = "case0350";
  local_18f8 = case0351;
  local_18f0 = 0;
  local_18e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_18e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18d8 = "case0351";
  local_18d0 = case0352;
  local_18c8 = 0;
  local_18b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_18c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18b0 = "case0352";
  local_18a8 = case0353;
  local_18a0 = 0;
  local_1890 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1898 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1888 = "case0353";
  local_1880 = case0354;
  local_1878 = 0;
  local_1868 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1870 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1860 = "case0354";
  local_1858 = case0355;
  local_1850 = 0;
  local_1840 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1848 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1838 = "case0355";
  local_1830 = case0356;
  local_1828 = 0;
  local_1818 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1820 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1810 = "case0356";
  local_1808 = case0357;
  local_1800 = 0;
  local_17f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_17f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17e8 = "case0357";
  local_17e0 = case0358;
  local_17d8 = 0;
  local_17c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_17d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17c0 = "case0358";
  local_17b8 = case0359;
  local_17b0 = 0;
  local_17a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_17a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1798 = "case0359";
  local_1790 = case0360;
  local_1788 = 0;
  local_1778 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1780 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1770 = "case0360";
  local_1768 = case0361;
  local_1760 = 0;
  local_1750 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1758 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1748 = "case0361";
  local_1740 = case0362;
  local_1738 = 0;
  local_1728 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1730 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1720 = "case0362";
  local_1718 = case0363;
  local_1710 = 0;
  local_1700 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1708 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16f8 = "case0363";
  local_16f0 = case0364;
  local_16e8 = 0;
  local_16d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_16e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16d0 = "case0364";
  local_16c8 = case0365;
  local_16c0 = 0;
  local_16b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_16b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16a8 = "case0365";
  local_16a0 = case0366;
  local_1698 = 0;
  local_1688 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1690 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1680 = "case0366";
  local_1678 = case0367;
  local_1670 = 0;
  local_1660 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1668 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1658 = "case0367";
  local_1650 = case0368;
  local_1648 = 0;
  local_1638 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1640 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1630 = "case0368";
  local_1628 = case0369;
  local_1620 = 0;
  local_1610 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1618 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1608 = "case0369";
  local_1600 = case0370;
  local_15f8 = 0;
  local_15e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_15f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15e0 = "case0370";
  local_15d8 = case0371;
  local_15d0 = 0;
  local_15c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_15c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15b8 = "case0371";
  local_15b0 = case0372;
  local_15a8 = 0;
  local_1598 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_15a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1590 = "case0372";
  local_1588 = case0373;
  local_1580 = 0;
  local_1570 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1578 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1568 = "case0373";
  local_1560 = case0374;
  local_1558 = 0;
  local_1548 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1550 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1540 = "case0374";
  local_1538 = case0375;
  local_1530 = 0;
  local_1520 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1528 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1518 = "case0375";
  local_1510 = case0376;
  local_1508 = 0;
  local_14f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1500 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14f0 = "case0376";
  local_14e8 = case0377;
  local_14e0 = 0;
  local_14d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_14d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14c8 = "case0377";
  local_14c0 = case0378;
  local_14b8 = 0;
  local_14a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_14b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14a0 = "case0378";
  local_1498 = case0379;
  local_1490 = 0;
  local_1480 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1488 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1478 = "case0379";
  local_1470 = case0380;
  local_1468 = 0;
  local_1458 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1460 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1450 = "case0380";
  local_1448 = case0381;
  local_1440 = 0;
  local_1430 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1438 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1428 = "case0381";
  local_1420 = case0382;
  local_1418 = 0;
  local_1408 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1410 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1400 = "case0382";
  local_13f8 = case0383;
  local_13f0 = 0;
  local_13e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_13e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13d8 = "case0383";
  local_13d0 = case0384;
  local_13c8 = 0;
  local_13b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_13c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13b0 = "case0384";
  local_13a8 = case0385;
  local_13a0 = 0;
  local_1390 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1398 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1388 = "case0385";
  local_1380 = case0386;
  local_1378 = 0;
  local_1368 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1370 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1360 = "case0386";
  local_1358 = case0387;
  local_1350 = 0;
  local_1340 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1348 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1338 = "case0387";
  local_1330 = case0388;
  local_1328 = 0;
  local_1318 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1320 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1310 = "case0388";
  local_1308 = case0389;
  local_1300 = 0;
  local_12f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_12f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12e8 = "case0389";
  local_12e0 = case0390;
  local_12d8 = 0;
  local_12c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_12d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12c0 = "case0390";
  local_12b8 = case0391;
  local_12b0 = 0;
  local_12a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_12a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1298 = "case0391";
  local_1290 = case0392;
  local_1288 = 0;
  local_1278 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1280 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1270 = "case0392";
  local_1268 = case0393;
  local_1260 = 0;
  local_1250 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1258 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1248 = "case0393";
  local_1240 = case0394;
  local_1238 = 0;
  local_1228 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1230 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1220 = "case0394";
  local_1218 = case0395;
  local_1210 = 0;
  local_1200 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1208 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11f8 = "case0395";
  local_11f0 = case0396;
  local_11e8 = 0;
  local_11d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_11e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11d0 = "case0396";
  local_11c8 = case0397;
  local_11c0 = 0;
  local_11b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_11b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11a8 = "case0397";
  local_11a0 = case0398;
  local_1198 = 0;
  local_1188 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1190 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1180 = "case0398";
  local_1178 = case0399;
  local_1170 = 0;
  local_1160 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1168 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1158 = "case0399";
  local_1150 = case0400;
  local_1148 = 0;
  local_1138 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1140 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1130 = "case0400";
  local_1128 = case0401;
  local_1120 = 0;
  local_1110 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1118 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1108 = "case0401";
  local_1100 = case0402;
  local_10f8 = 0;
  local_10e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_10f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10e0 = "case0402";
  local_10d8 = case0403;
  local_10d0 = 0;
  local_10c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_10c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10b8 = "case0403";
  local_10b0 = case0404;
  local_10a8 = 0;
  local_1098 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_10a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1090 = "case0404";
  local_1088 = case0405;
  local_1080 = 0;
  local_1070 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1078 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1068 = "case0405";
  local_1060 = case0406;
  local_1058 = 0;
  local_1048 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1050 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1040 = "case0406";
  local_1038 = case0407;
  local_1030 = 0;
  local_1020 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1028 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1018 = "case0407";
  local_1010 = case0408;
  local_1008 = 0;
  local_ff8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_1000 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_ff0 = "case0408";
  local_fe8 = case0409;
  local_fe0 = 0;
  local_fd0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_fd8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_fc8 = "case0409";
  local_fc0 = case0410;
  local_fb8 = 0;
  local_fa8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_fb0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_fa0 = "case0410";
  local_f98 = case0411;
  local_f90 = 0;
  local_f80 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f88 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f78 = "case0411";
  local_f70 = case0412;
  local_f68 = 0;
  local_f58 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f60 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f50 = "case0412";
  local_f48 = case0413;
  local_f40 = 0;
  local_f30 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f38 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f28 = "case0413";
  local_f20 = case0414;
  local_f18 = 0;
  local_f08 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f10 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f00 = "case0414";
  local_ef8 = case0415;
  local_ef0 = 0;
  local_ee0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ee8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ed8 = "case0415";
  local_ed0 = case0416;
  local_ec8 = 0;
  local_eb8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ec0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_eb0 = "case0416";
  local_ea8 = case0417;
  local_ea0 = 0;
  local_e90 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e98 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e88 = "case0417";
  local_e80 = case0418;
  local_e78 = 0;
  local_e68 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e70 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e60 = "case0418";
  local_e58 = case0419;
  local_e50 = 0;
  local_e40 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e48 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e38 = "case0419";
  local_e30 = case0420;
  local_e28 = 0;
  local_e18 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e20 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e10 = "case0420";
  local_e08 = case0421;
  local_e00 = 0;
  local_df0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_df8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_de8 = "case0421";
  local_de0 = case0422;
  local_dd8 = 0;
  local_dc8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_dd0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_dc0 = "case0422";
  local_db8 = case0423;
  local_db0 = 0;
  local_da0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_da8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d98 = "case0423";
  local_d90 = case0424;
  local_d88 = 0;
  local_d78 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d80 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d70 = "case0424";
  local_d68 = case0425;
  local_d60 = 0;
  local_d50 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d58 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d48 = "case0425";
  local_d40 = case0426;
  local_d38 = 0;
  local_d28 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d30 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d20 = "case0426";
  local_d18 = case0427;
  local_d10 = 0;
  local_d00 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d08 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_cf8 = "case0427";
  local_cf0 = case0428;
  local_ce8 = 0;
  local_cd8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ce0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_cd0 = "case0428";
  local_cc8 = case0429;
  local_cc0 = 0;
  local_cb0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_cb8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ca8 = "case0429";
  local_ca0 = case0430;
  local_c98 = 0;
  local_c88 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c90 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c80 = "case0430";
  local_c78 = case0431;
  local_c70 = 0;
  local_c60 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c68 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c58 = "case0431";
  local_c50 = case0432;
  local_c48 = 0;
  local_c38 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c40 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c30 = "case0432";
  local_c28 = case0433;
  local_c20 = 0;
  local_c10 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c18 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c08 = "case0433";
  local_c00 = case0434;
  local_bf8 = 0;
  local_be8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_bf0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_be0 = "case0434";
  local_bd8 = case0435;
  local_bd0 = 0;
  local_bc0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_bc8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_bb8 = "case0435";
  local_bb0 = case0436;
  local_ba8 = 0;
  local_b98 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ba0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b90 = "case0436";
  local_b88 = case0437;
  local_b80 = 0;
  local_b70 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b78 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b68 = "case0437";
  local_b60 = case0438;
  local_b58 = 0;
  local_b48 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b50 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b40 = "case0438";
  local_b38 = case0439;
  local_b30 = 0;
  local_b20 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b28 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b18 = "case0439";
  local_b10 = case0440;
  local_b08 = 0;
  local_af8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b00 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_af0 = "case0440";
  local_ae8 = case0441;
  local_ae0 = 0;
  local_ad0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ad8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ac8 = "case0441";
  local_ac0 = case0442;
  local_ab8 = 0;
  local_aa8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ab0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_aa0 = "case0442";
  local_a98 = case0443;
  local_a90 = 0;
  local_a80 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a88 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a78 = "case0443";
  local_a70 = case0444;
  local_a68 = 0;
  local_a58 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a60 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a50 = "case0444";
  local_a48 = case0445;
  local_a40 = 0;
  local_a30 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a38 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a28 = "case0445";
  local_a20 = case0446;
  local_a18 = 0;
  local_a08 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a10 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a00 = "case0446";
  local_9f8 = case0447;
  local_9f0 = 0;
  local_9e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_9e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9d8 = "case0447";
  local_9d0 = case0448;
  local_9c8 = 0;
  local_9b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_9c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9b0 = "case0448";
  local_9a8 = case0449;
  local_9a0 = 0;
  local_990 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_998 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_988 = "case0449";
  local_980 = case0450;
  local_978 = 0;
  local_968 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_970 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_960 = "case0450";
  local_958 = case0451;
  local_950 = 0;
  local_940 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_948 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_938 = "case0451";
  local_930 = case0452;
  local_928 = 0;
  local_918 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_920 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_910 = "case0452";
  local_908 = case0453;
  local_900 = 0;
  local_8f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_8f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8e8 = "case0453";
  local_8e0 = case0454;
  local_8d8 = 0;
  local_8c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_8d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8c0 = "case0454";
  local_8b8 = case0455;
  local_8b0 = 0;
  local_8a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_8a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_898 = "case0455";
  local_890 = case0456;
  local_888 = 0;
  local_878 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_880 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_870 = "case0456";
  local_868 = case0457;
  local_860 = 0;
  local_850 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_858 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_848 = "case0457";
  local_840 = case0458;
  local_838 = 0;
  local_828 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_830 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_820 = "case0458";
  local_818 = case0459;
  local_810 = 0;
  local_800 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_808 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7f8 = "case0459";
  local_7f0 = case0460;
  local_7e8 = 0;
  local_7d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_7e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7d0 = "case0460";
  local_7c8 = case0461;
  local_7c0 = 0;
  local_7b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_7b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7a8 = "case0461";
  local_7a0 = case0462;
  local_798 = 0;
  local_788 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_790 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_780 = "case0462";
  local_778 = case0463;
  local_770 = 0;
  local_760 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_768 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_758 = "case0463";
  local_750 = case0464;
  local_748 = 0;
  local_738 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_740 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_730 = "case0464";
  local_728 = case0465;
  local_720 = 0;
  local_710 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_718 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_708 = "case0465";
  local_700 = case0466;
  local_6f8 = 0;
  local_6e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_6f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6e0 = "case0466";
  local_6d8 = case0467;
  local_6d0 = 0;
  local_6c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_6c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6b8 = "case0467";
  local_6b0 = case0468;
  local_6a8 = 0;
  local_698 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_6a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_690 = "case0468";
  local_688 = case0469;
  local_680 = 0;
  local_670 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_678 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_668 = "case0469";
  local_660 = case0470;
  local_658 = 0;
  local_648 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_650 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_640 = "case0470";
  local_638 = case0471;
  local_630 = 0;
  local_620 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_628 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_618 = "case0471";
  local_610 = case0472;
  local_608 = 0;
  local_5f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_600 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5f0 = "case0472";
  local_5e8 = case0473;
  local_5e0 = 0;
  local_5d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_5d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5c8 = "case0473";
  local_5c0 = case0474;
  local_5b8 = 0;
  local_5a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_5b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5a0 = "case0474";
  local_598 = case0475;
  local_590 = 0;
  local_580 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_588 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_578 = "case0475";
  local_570 = case0476;
  local_568 = 0;
  local_558 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_560 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_550 = "case0476";
  local_548 = case0477;
  local_540 = 0;
  local_530 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_538 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_528 = "case0477";
  local_520 = case0478;
  local_518 = 0;
  local_508 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_510 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_500 = "case0478";
  local_4f8 = case0479;
  local_4f0 = 0;
  local_4e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_4e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4d8 = "case0479";
  local_4d0 = case0480;
  local_4c8 = 0;
  local_4b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_4c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4b0 = "case0480";
  local_4a8 = case0481;
  local_4a0 = 0;
  local_490 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_498 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_488 = "case0481";
  local_480 = case0482;
  local_478 = 0;
  local_468 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_470 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_460 = "case0482";
  local_458 = case0483;
  local_450 = 0;
  local_440 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_448 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_438 = "case0483";
  local_430 = case0484;
  local_428 = 0;
  local_418 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_420 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_410 = "case0484";
  local_408 = case0485;
  local_400 = 0;
  local_3f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_3f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3e8 = "case0485";
  local_3e0 = case0486;
  local_3d8 = 0;
  local_3c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_3d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3c0 = "case0486";
  local_3b8 = case0487;
  local_3b0 = 0;
  local_3a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_398 = "case0487";
  local_390 = case0488;
  local_388 = 0;
  local_378 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_370 = "case0488";
  local_368 = case0489;
  local_360 = 0;
  local_350 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_358 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_348 = "case0489";
  local_340 = case0490;
  local_338 = 0;
  local_328 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_330 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_320 = "case0490";
  local_318 = case0491;
  local_310 = 0;
  local_300 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2f8 = "case0491";
  local_2f0 = case0492;
  local_2e8 = 0;
  local_2d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_2e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2d0 = "case0492";
  local_2c8 = case0493;
  local_2c0 = 0;
  local_2b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_2b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2a8 = "case0493";
  local_2a0 = case0494;
  local_298 = 0;
  local_288 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_290 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_280 = "case0494";
  local_278 = case0495;
  local_270 = 0;
  local_260 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_258 = "case0495";
  local_250 = case0496;
  local_248 = 0;
  local_238 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_240 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_230 = "case0496";
  local_228 = case0497;
  local_220 = 0;
  local_210 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_208 = "case0497";
  local_200 = case0498;
  local_1f8 = 0;
  local_1e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_1f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1e0 = "case0498";
  local_1d8 = case0499;
  local_1d0 = 0;
  local_1c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1b8 = "case0499";
  local_1b0 = case0500;
  local_1a8 = 0;
  local_198 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_190 = "case0500";
  local_188 = case0501;
  local_180 = 0;
  local_170 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_168 = "case0501";
  local_160 = case0502;
  local_158 = 0;
  local_148 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_150 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_140 = "case0502";
  local_138 = case0503;
  local_130 = 0;
  local_120 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_118 = "case0503";
  local_110 = case0504;
  local_108 = 0;
  local_f8 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f0 = "case0504";
  local_e8 = case0505;
  local_e0 = 0;
  local_d0 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_c8 = "case0505";
  local_c0 = case0506;
  local_b8 = 0;
  local_a8 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_a0 = "case0506";
  local_98 = case0507;
  local_90 = 0;
  local_80 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_78 = "case0507";
  local_70 = case0508;
  local_68 = 0;
  local_58 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_50 = "case0508";
  local_48 = case0509;
  local_40 = 0;
  local_30 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_28 = "case0509";
  __l._M_len = 0x10e;
  __l._M_array = &local_2a50;
  std::
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,&local_2a51);
  lVar1 = 0x2a08;
  do {
    std::_Function_base::~_Function_base
              ((_Function_base *)((long)&local_2a50.first.super__Function_base._M_functor + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return;
}

Assistant:

SemanticModelTester(TestSuite* suite) : Tester(suite) {}